

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void __thiscall w3Module::read_exports(w3Module *this,uint8_t **cursor)

{
  w3Export *this_00;
  int iVar1;
  pointer pwVar2;
  w3Export *pwVar3;
  w3Export **ppwVar4;
  byte bVar5;
  uint32_t uVar6;
  PCH pcVar7;
  ulong __new_size;
  char *expr;
  ulong uVar8;
  long lVar9;
  undefined1 local_68 [56];
  
  puts("reading section 7");
  uVar6 = read_varuint32(this,cursor);
  __new_size = (ulong)uVar6;
  printf("reading exports7 count:%lX\n",__new_size);
  std::vector<w3Export,_std::allocator<w3Export>_>::resize(&this->exports,__new_size);
  lVar9 = 0;
  uVar8 = 0;
  do {
    if (__new_size == uVar8) {
      printf("read exports7 size:%lX\n",__new_size);
      return;
    }
    pwVar2 = (this->exports).super__Vector_base<w3Export,_std::allocator<w3Export>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_00 = (w3Export *)((long)&(pwVar2->name).data + lVar9);
    read_string((WasmString *)local_68,this,cursor);
    WasmString::operator=((WasmString *)this_00,(WasmString *)local_68);
    std::__cxx11::string::~string((string *)(local_68 + 0x10));
    bVar5 = read_byte(this,cursor);
    *(uint *)((long)&pwVar2->tag + lVar9) = (uint)bVar5;
    uVar6 = read_varuint32(this,cursor);
    *(uint32_t *)((long)&pwVar2->field_4 + lVar9) = uVar6;
    iVar1 = *(int *)((long)&(pwVar2->name).builtin + lVar9);
    (&pwVar2->is_main)[lVar9] = iVar1 == 1;
    (&pwVar2->is_start)[lVar9] = iVar1 == 2;
    pcVar7 = WasmString::c_str((WasmString *)this_00);
    printf("read_export %lX:%lX %s tag:%X index:%X is_main:%X is_start:%X\n",uVar8,__new_size,pcVar7
           ,(ulong)*(uint *)((long)&pwVar2->tag + lVar9),
           (ulong)*(uint *)((long)&pwVar2->field_4 + lVar9),(ulong)(&pwVar2->is_main)[lVar9],
           (ulong)(&pwVar2->is_start)[lVar9]);
    if ((&pwVar2->is_start)[lVar9] == true) {
      pwVar3 = this->start;
      expr = "!start";
      ppwVar4 = &this->start;
joined_r0x0011242d:
      if (pwVar3 != (w3Export *)0x0) {
        AssertFailed(expr);
      }
      *ppwVar4 = this_00;
    }
    else if ((&pwVar2->is_main)[lVar9] == true) {
      pwVar3 = this->main;
      expr = "!main";
      ppwVar4 = &this->main;
      goto joined_r0x0011242d;
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x48;
  } while( true );
}

Assistant:

void w3Module::read_exports (uint8_t** cursor)
{
    printf ("reading section 7\n");
    const size_t size = read_varuint32 (cursor);
    printf ("reading exports7 count:%" FORMAT_SIZE "X\n", size);
    exports.resize (size);
    for (size_t i = 0; i < size; ++i)
    {
        w3Export& a = exports [i];
        a.name = read_string (cursor);
        a.tag = (w3ExportTag)read_byte (cursor);
        a.function = read_varuint32 (cursor);
        a.is_main = a.name.builtin == w3BuiltinString_main;
        a.is_start = a.name.builtin == w3BuiltinString_start;
        printf ("read_export %" FORMAT_SIZE "X:%" FORMAT_SIZE "X %s tag:%X index:%X is_main:%X is_start:%X\n", i, size, a.name.c_str (), a.tag, a.function, a.is_main, a.is_start);

        if (a.is_start)
        {
            Assert (!start);
            start = &a;
        }
        else if (a.is_main)
        {
            Assert (!main);
            main = &a;
        }
    }
    printf ("read exports7 size:%" FORMAT_SIZE "X\n", size);
}